

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decorator.hpp
# Opt level: O0

void __thiscall
boost::unit_test::decorator::expected_failures::~expected_failures(expected_failures *this)

{
  void *in_RDI;
  
  ~expected_failures((expected_failures *)0x2480a8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

class BOOST_TEST_DECL expected_failures : public decorator::base {
public:
    explicit                expected_failures( counter_t ef ) : m_exp_fail( ef ) {}

private:
    // decorator::base interface
    virtual void            apply( test_unit& tu );
    virtual base_ptr        clone() const { return base_ptr(new expected_failures( m_exp_fail )); }

    // Data members
    counter_t               m_exp_fail;
}